

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O1

void __thiscall Balk::save_result(Balk *this,string *folder_name,size_t num_of_points)

{
  pointer psVar1;
  element_type *peVar2;
  char *pcVar3;
  undefined8 uVar4;
  ostream *poVar5;
  int iVar6;
  long *plVar7;
  ulong uVar8;
  size_t sVar9;
  shared_ptr<Term> *el;
  long lVar10;
  pointer psVar11;
  double dVar12;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  path p;
  ofstream file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  string *local_270;
  double local_268;
  double dStack_260;
  path local_258;
  undefined1 local_230 [16];
  char local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  long *local_1d0 [2];
  long local_1c0 [17];
  ios_base local_138 [264];
  
  local_230._0_8_ = local_220;
  local_270 = folder_name;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"out1.txt","");
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"out2.txt","");
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"out3.txt","");
  plVar7 = local_1c0;
  local_1d0[0] = plVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"out4.txt","");
  __l._M_len = 4;
  __l._M_array = (iterator)local_230;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_288,__l,(allocator_type *)&local_258);
  lVar10 = -0x80;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    uVar4 = _memcpy;
    pcVar3 = _VTT;
    plVar7 = plVar7 + -4;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0);
  if (local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    dStack_260 = (double)CONCAT44(0x45300000,(int)(num_of_points >> 0x20)) - 1.9342813113834067e+25;
    local_268 = dStack_260 + ((double)CONCAT44(0x43300000,(int)num_of_points) - 4503599627370496.0);
    uVar8 = 0;
    do {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_258,local_270,auto_format);
      std::filesystem::__cxx11::path::_M_append
                (&local_258,
                 local_288.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_string_length,
                 local_288.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p);
      std::ofstream::ofstream((ofstream *)local_230);
      std::ofstream::open((char *)local_230,(_Ios_Openmode)local_258._M_pathname._M_dataplus._M_p);
      if (num_of_points != 0) {
        sVar9 = 0;
        do {
          psVar11 = (this->terms).
                    super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar1 = (this->terms).
                   super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          dVar13 = 0.0;
          if (psVar11 != psVar1) {
            iVar6 = 0;
            do {
              peVar2 = (psVar11->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              dVar12 = (double)(this->balk_size * (int)sVar9);
              if (peVar2->is_unknown == false) {
                (*peVar2->_vptr_Term[2])
                          ((dVar12 * this->segment_length) / local_268,peVar2,uVar8 & 0xffffffff);
                dVar12 = extraout_XMM0_Qa_00;
              }
              else {
                (*peVar2->_vptr_Term[2])
                          ((dVar12 * this->segment_length) / local_268,peVar2,uVar8 & 0xffffffff);
                lVar10 = (long)iVar6;
                iVar6 = iVar6 + 1;
                dVar12 = extraout_XMM0_Qa *
                         (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar10];
              }
              dVar13 = dVar13 + dVar12;
              psVar11 = psVar11 + 1;
            } while (psVar11 != psVar1);
          }
          if (uVar8 < 2) {
            dVar13 = dVar13 / (this->E * this->J);
          }
          poVar5 = std::ostream::_M_insert<double>(dVar13);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          sVar9 = sVar9 + 1;
        } while (sVar9 != num_of_points);
      }
      std::ofstream::close();
      local_230._0_8_ = pcVar3;
      *(undefined8 *)(local_230 + *(long *)(pcVar3 + -0x18)) = uVar4;
      std::filebuf::~filebuf((filebuf *)(local_230 + 8));
      std::ios_base::~ios_base(local_138);
      std::filesystem::__cxx11::path::~path(&local_258);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)local_288.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_288.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  return;
}

Assistant:

void Balk::save_result(const std::string &folder_name, size_t num_of_points)
{
    std::vector<std::string> outputs = {"out1.txt", "out2.txt", "out3.txt", "out4.txt"};
    for (int num = 0; num < outputs.size(); ++num)
    {
        std::filesystem::path p = folder_name;
        p /= outputs[num];
        std::ofstream file;
        file.open(p);

        for (int i = 0; i < num_of_points; ++i)
        {
            double res = 0;
            int ind = 0;
            for (const auto &el : terms)
            {
                if (!(el->isUnknown()))
                {
                    res += el->calculate(i * balk_size * segment_length / num_of_points, num);
                }
                else
                {
                    res += el->calculate(i * balk_size * segment_length / num_of_points, num) * x[ind++];
                }
            }
            if (num <= 1) 
            {
                res /= (E * J);
            }
            file << res << std::endl;
        }
        file.close();
    }
}